

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

ostream * __thiscall smf::Option_register::print(Option_register *this,ostream *out)

{
  ostream *poVar1;
  void *this_00;
  ostream *out_local;
  Option_register *this_local;
  
  poVar1 = std::operator<<(out,"definition:\t");
  poVar1 = std::operator<<(poVar1,(string *)this);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(out,"description:\t");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_description);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(out,"defaultOption:\t");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_defaultOption);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(out,"modifiedOption:\t");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_modifiedOption);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(out,"modifiedQ:\t\t");
  this_00 = (void *)std::ostream::operator<<(poVar1,(bool)(this->m_modifiedQ & 1));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(out,"type:\t\t");
  poVar1 = std::operator<<(poVar1,this->m_type);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return out;
}

Assistant:

std::ostream& Option_register::print(std::ostream& out) {
	out << "definition:\t"     << m_definition     << std::endl;
	out << "description:\t"    << m_description    << std::endl;
	out << "defaultOption:\t"  << m_defaultOption  << std::endl;
	out << "modifiedOption:\t" << m_modifiedOption << std::endl;
	out << "modifiedQ:\t\t"    << m_modifiedQ      << std::endl;
	out << "type:\t\t"         << m_type           << std::endl;
	return out;
}